

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::TrackPid(ScriptContext *this,PropertyRecord *propertyRecord)

{
  BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *local_20;
  PropertyRecord *local_18;
  PropertyRecord *propertyRecord_local;
  
  if ((0x2d8 < propertyRecord->pid) && (propertyRecord->isBound == false)) {
    local_18 = propertyRecord;
    this_00 = (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
               *)JavascriptLibrary::EnsureReferencedPropertyRecordList
                           ((this->super_ScriptContextBase).javascriptLibrary);
    local_20 = propertyRecord;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              (this_00,&local_20,&local_18);
  }
  return;
}

Assistant:

void ScriptContext::TrackPid(const PropertyRecord* propertyRecord)
    {
        if (IsBuiltInPropertyId(propertyRecord->GetPropertyId()) || propertyRecord->IsBound())
        {
            return;
        }

        if (-1 != this->GetLibrary()->EnsureReferencedPropertyRecordList()->AddNew(propertyRecord))
        {
            RECYCLER_PERF_COUNTER_INC(PropertyRecordBindReference);
        }
    }